

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(basic_appender<char> out,char value)

{
  basic_appender<char> bVar1;
  char in_SIL;
  basic_appender<char> in_RDI;
  basic_appender<char> it;
  basic_appender<char> *in_stack_ffffffffffffffc0;
  basic_appender<char> in_stack_ffffffffffffffd0;
  basic_appender<char> local_20;
  char local_11;
  basic_appender<char> local_10;
  
  local_11 = in_SIL;
  local_10.container = in_RDI.container;
  local_20 = reserve<char>(in_RDI,in_stack_ffffffffffffffd0.container);
  basic_appender<char>::operator++(&local_20,0);
  basic_appender<char>::operator*((basic_appender<char> *)&stack0xffffffffffffffd0);
  basic_appender<char>::operator=(in_stack_ffffffffffffffc0,local_11);
  bVar1 = base_iterator<fmt::v11::basic_appender<char>>(local_10,local_20);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value) -> OutputIt {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}